

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_matrix.cpp
# Opt level: O2

int bitcount(int max,uint mask)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = 0;
  if (max < 1) {
    max = 0;
  }
  for (uVar2 = 0; max != uVar2; uVar2 = uVar2 + 1) {
    iVar1 = iVar1 + (uint)((mask >> (uVar2 & 0x1f) & 1) != 0);
  }
  return iVar1;
}

Assistant:

static int
bitcount(int max, unsigned mask)
{
  int c = 0;
  int i;

  for (i = 0; i < max; ++i)
    if (mask & (1 << i))
      ++c;
  return c;
}